

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuslistener.cpp
# Opt level: O0

optional<QDBusListener::ChangeSignal> __thiscall
QDBusListener::findSignal(QDBusListener *this,QString *location,QString *key)

{
  bool bVar1;
  DBusKey *in_RDX;
  undefined8 extraout_RDX;
  QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
  *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  optional<QDBusListener::ChangeSignal> oVar2;
  const_iterator it;
  DBusKey dkey;
  optional<QDBusListener::ChangeSignal> ret;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  DBusKey *in_stack_ffffffffffffff60;
  undefined1 local_70;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  _Storage<QDBusListener::ChangeSignal,_true> local_14;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_48,0,0x30);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  DBusKey::DBusKey(in_RDX,in_RDI,&in_stack_ffffffffffffff60->location);
  local_14 = (_Storage<QDBusListener::ChangeSignal,_true>)&DAT_aaaaaaaaaaaaaaaa;
  local_c = 0xaaaaaaaa;
  std::optional<QDBusListener::ChangeSignal>::optional
            ((optional<QDBusListener::ChangeSignal> *)0xb25aa3);
  QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
  ::find(in_RSI,in_RDX);
  QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
  ::cend((QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
          *)0xb25ae6);
  bVar1 = QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
          ::const_iterator::operator!=
                    ((const_iterator *)in_stack_ffffffffffffff60,
                     (const_iterator *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58)
                    );
  if (bVar1) {
    QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
    ::const_iterator::value((const_iterator *)0xb25b0f);
    std::optional<QDBusListener::ChangeSignal>::emplace<QDBusListener::ChangeSignal_const&>
              ((optional<QDBusListener::ChangeSignal> *)in_stack_ffffffffffffff60,
               (ChangeSignal *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  }
  DBusKey::~DBusKey(in_stack_ffffffffffffff60);
  local_70 = (undefined1)local_c;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  oVar2.super__Optional_base<QDBusListener::ChangeSignal,_true,_true>._M_payload.
  super__Optional_payload_base<QDBusListener::ChangeSignal>._8_4_ =
       (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),local_70);
  oVar2.super__Optional_base<QDBusListener::ChangeSignal,_true,_true>._M_payload.
  super__Optional_payload_base<QDBusListener::ChangeSignal>._M_payload = local_14;
  return (optional<QDBusListener::ChangeSignal>)
         oVar2.super__Optional_base<QDBusListener::ChangeSignal,_true,_true>._M_payload.
         super__Optional_payload_base<QDBusListener::ChangeSignal>;
}

Assistant:

std::optional<QDBusListener::ChangeSignal>
    QDBusListener::findSignal(const QString &location, const QString &key) const
{
    const DBusKey dkey(location, key);
    std::optional<QDBusListener::ChangeSignal> ret;
    const auto it = m_signalMap.find(dkey);
    if (it != m_signalMap.cend())
        ret.emplace(it.value());

    return ret;
}